

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

int __thiscall QDate::dayOfYear(QDate *this,QCalendar cal)

{
  ulong uVar1;
  int iVar2;
  QDate QVar3;
  long in_FS_OFFSET;
  QCalendar local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d_ptr = cal.d_ptr;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    iVar2 = year(this,cal);
    QVar3 = QCalendar::dateFromParts(&local_30,iVar2,1,1);
    uVar1 = QVar3.jd - 0xb69f248055;
    if (0xfffffe92c1eb868b < uVar1) {
      QVar3.jd = (qint64)(((int)this->jd - (int)QVar3.jd) + 1);
      if (this->jd - 0xb69f248055U < 0xfffffe92c1eb868c) {
        QVar3.jd = 1;
      }
      if (uVar1 < 0xfffffe92c1eb868c) {
        QVar3.jd = 1;
      }
    }
    iVar2 = (int)QVar3.jd;
    if (0xfffffe92c1eb868b < uVar1) goto LAB_0034b319;
  }
  iVar2 = 0;
LAB_0034b319:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QDate::dayOfYear(QCalendar cal) const
{
    if (isValid()) {
        QDate firstDay = cal.dateFromParts(year(cal), 1, 1);
        if (firstDay.isValid())
            return firstDay.daysTo(*this) + 1;
    }
    return 0;
}